

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

void simd::BitwiseOr(Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
                    uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t width
                    ,uint32_t height,SIMDType simdType)

{
  uint32_t rowSizeIn1;
  uint32_t rowSizeIn2;
  uint32_t rowSizeOut;
  ImageTemplate<unsigned_char> *image;
  Image *pIVar1;
  byte bVar2;
  uint32_t uVar3;
  uint8_t *in1Y;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  uint8_t *outY;
  uint simdWidth;
  bool bVar4;
  uint32_t local_d8;
  uint local_d4;
  ImageTemplate<unsigned_char> *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  Image *local_a8;
  ulong local_a0;
  ulong local_98;
  Image *local_90;
  ulong local_88;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  local_c0 = CONCAT44(in_register_0000008c,startY2);
  local_b0 = CONCAT44(in_register_00000084,startX2);
  local_b8 = CONCAT44(in_register_00000034,startX1);
  local_c8 = CONCAT44(in_register_00000014,startY1);
  local_88 = (ulong)height;
  local_a0 = (ulong)startYOut;
  local_98 = (ulong)startXOut;
  local_a8 = out;
  local_d0 = in2;
  do {
    bVar2 = Image_Function::CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                      (in1,local_d0,local_a8);
    if (simdType == cpu_function) break;
    uVar3 = getSimdSize(simdType);
    pIVar1 = local_a8;
    image = local_d0;
    local_d4 = bVar2 * width;
    if (uVar3 <= local_d4) {
      local_d8 = (uint32_t)local_88;
      local_90 = in1;
      Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
                (in1,(uint32_t)local_b8,(uint32_t)local_c8,local_d0,(uint32_t)local_b0,
                 (uint32_t)local_c0,local_a8,(uint32_t)local_98,(uint32_t)local_a0,width,local_d8);
      PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,image);
      PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_80,pIVar1);
      pIVar1 = local_90;
      Image_Function::
      OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
                (&local_d4,&local_d8,local_90,&local_58,&local_80);
      PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_80);
      PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
      rowSizeIn1 = pIVar1->_rowSize;
      rowSizeIn2 = local_d0->_rowSize;
      rowSizeOut = local_a8->_rowSize;
      simdWidth = local_d4 / uVar3;
      outY = local_a8->_data +
             (ulong)((int)local_98 * (uint)bVar2) + (ulong)((int)local_a0 * rowSizeOut);
      in1Y = pIVar1->_data +
             (ulong)((int)local_b8 * (uint)bVar2) + (ulong)((int)local_c8 * rowSizeIn1);
      if (simdType == sse_function) {
        sse::BitwiseOr(rowSizeIn1,rowSizeIn2,rowSizeOut,in1Y,
                       local_d0->_data +
                       (ulong)((int)local_b0 * (uint)bVar2) + (ulong)((int)local_c0 * rowSizeIn2),
                       outY,outY + local_d8 * rowSizeOut,simdWidth,simdWidth * uVar3,
                       local_d4 % uVar3);
      }
      else if (simdType == avx_function) {
        avx::BitwiseOr(rowSizeIn1,rowSizeIn2,rowSizeOut,in1Y,
                       local_d0->_data +
                       (ulong)((int)local_b0 * (uint)bVar2) + (ulong)((int)local_c0 * rowSizeIn2),
                       outY,outY + local_d8 * rowSizeOut,simdWidth,simdWidth * uVar3,
                       local_d4 % uVar3);
      }
      return;
    }
    bVar4 = simdType == avx_function;
    simdType = sse_function;
  } while (bVar4);
  Image_Function::BitwiseOr
            (in1,(uint32_t)local_b8,(uint32_t)local_c8,local_d0,(uint32_t)local_b0,
             (uint32_t)local_c0,out,startXOut,startYOut,width,height);
  return;
}

Assistant:

void BitwiseOr( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                    Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height, SIMDType simdType )
    {
        const uint8_t colorCount = Image_Function::CommonColorCount( in1, in2, out );
        const uint32_t simdSize = getSimdSize( simdType );

        if( (simdType == cpu_function) || (width * colorCount < simdSize) ) {
            AVX_CODE( BitwiseOr( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height, sse_function ); )

            Image_Function::BitwiseOr( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
            return;
        }

        Image_Function::ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
        width = width * colorCount;

        Image_Function::OptimiseRoi( width, height, in1, in2, out );

        const uint32_t rowSizeIn1 = in1.rowSize();
        const uint32_t rowSizeIn2 = in2.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * in1Y = in1.data() + startY1   * rowSizeIn1 + startX1   * colorCount;
        const uint8_t * in2Y = in2.data() + startY2   * rowSizeIn2 + startX2   * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::BitwiseOr( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        SSE_CODE( sse::BitwiseOr( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::BitwiseOr( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }